

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O3

TrieNode<unsigned_short> * __thiscall
BurstSimple<unsigned_short>::operator()
          (BurstSimple<unsigned_short> *this,
          vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket,size_t depth)

{
  pointer ppuVar1;
  uchar *puVar2;
  iterator iVar3;
  uint uVar4;
  TrieNode<unsigned_short> *__s;
  ulong uVar5;
  vector<unsigned_char*,std::allocator<unsigned_char*>> *pvVar6;
  long lVar7;
  ushort uVar8;
  uchar **__args;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint j;
  array<unsigned_short,_64UL> cache;
  array<unsigned_char_*,_64UL> strings;
  ushort auStack_2b0 [64];
  uchar *local_230 [64];
  
  __s = (TrieNode<unsigned_short> *)operator_new(0x82000);
  uVar9 = 0;
  memset(__s,0,0x82000);
  uVar5 = (ulong)((long)(bucket->
                        super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(bucket->
                       super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                       _M_impl.super__Vector_impl_data._M_start) >> 3;
  uVar4 = (uint)uVar5;
  if (0x3f < uVar4) {
    lVar11 = 0;
    uVar9 = 0;
    do {
      ppuVar1 = (bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      lVar7 = 0;
      do {
        puVar2 = *(uchar **)((long)ppuVar1 + lVar7 * 8 + lVar11);
        local_230[lVar7] = puVar2;
        if (puVar2 == (uchar *)0x0) goto LAB_001a8879;
        if (puVar2[depth] == '\0') {
          uVar8 = 0;
        }
        else {
          uVar8 = CONCAT11(puVar2[depth],puVar2[depth + 1]);
        }
        auStack_2b0[lVar7] = uVar8;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x40);
      __args = local_230;
      lVar7 = 0;
      do {
        uVar8 = auStack_2b0[lVar7];
        pvVar6 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)
                 (__s->buckets)._M_elems[uVar8];
        if (pvVar6 == (vector<unsigned_char*,std::allocator<unsigned_char*>> *)0x0) {
          pvVar6 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)operator_new(0x18);
          *(undefined8 *)pvVar6 = 0;
          *(undefined8 *)(pvVar6 + 8) = 0;
          *(undefined8 *)(pvVar6 + 0x10) = 0;
          (__s->buckets)._M_elems[uVar8] = pvVar6;
        }
        iVar3._M_current = *(uchar ***)(pvVar6 + 8);
        if (iVar3._M_current == *(uchar ***)(pvVar6 + 0x10)) {
          std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
          _M_realloc_insert<unsigned_char*const&>(pvVar6,iVar3,__args);
        }
        else {
          *iVar3._M_current = *__args;
          *(long *)(pvVar6 + 8) = *(long *)(pvVar6 + 8) + 8;
        }
        lVar7 = lVar7 + 1;
        __args = __args + 1;
      } while (lVar7 != 0x40);
      uVar9 = uVar9 + 0x40;
      lVar11 = lVar11 + 0x200;
    } while (uVar9 < (uVar4 & 0xffffffc0));
  }
  if ((uint)uVar9 < uVar4) {
    uVar9 = uVar9 & 0xffffffff;
    do {
      puVar2 = (bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar9];
      local_230[0] = puVar2;
      if (puVar2 == (uchar *)0x0) {
LAB_001a8879:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar2[depth] == '\0') {
        uVar10 = 0;
      }
      else {
        uVar10 = (ulong)CONCAT11(puVar2[depth],puVar2[depth + 1]);
      }
      pvVar6 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)
               (__s->buckets)._M_elems[uVar10];
      if (pvVar6 == (vector<unsigned_char*,std::allocator<unsigned_char*>> *)0x0) {
        pvVar6 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)operator_new(0x18);
        *(undefined8 *)pvVar6 = 0;
        *(undefined8 *)(pvVar6 + 8) = 0;
        *(undefined8 *)(pvVar6 + 0x10) = 0;
        (__s->buckets)._M_elems[uVar10] = pvVar6;
      }
      iVar3._M_current = *(uchar ***)(pvVar6 + 8);
      if (iVar3._M_current == *(uchar ***)(pvVar6 + 0x10)) {
        std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
        _M_realloc_insert<unsigned_char*const&>(pvVar6,iVar3,local_230);
      }
      else {
        *iVar3._M_current = puVar2;
        *(long *)(pvVar6 + 8) = *(long *)(pvVar6 + 8) + 8;
      }
      uVar9 = uVar9 + 1;
    } while ((uVar5 & 0xffffffff) != uVar9);
  }
  return __s;
}

Assistant:

TrieNode<CharT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT>* new_node = new TrieNode<CharT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			array<CharT, 64> cache;
			array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = static_cast<BucketT*>(
					new_node->buckets[ch]);
				if (not sub_bucket) {
					new_node->buckets[ch] = sub_bucket
						= new BucketT;
				}
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = static_cast<BucketT*>(
				new_node->buckets[ch]);
			if (not sub_bucket) {
				new_node->buckets[ch] = sub_bucket
					= new BucketT;
			}
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}